

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# patch_optimize_destel_well_map.hpp
# Opt level: O0

void __thiscall
PatchOptimizeDestelWellMap::inject_code(PatchOptimizeDestelWellMap *this,ROM *rom,World *world)

{
  initializer_list<md::AddressRegister> __l;
  initializer_list<md::DataRegister> __l_00;
  initializer_list<unsigned_char> __l_01;
  initializer_list<md::AddressRegister> __l_02;
  initializer_list<md::DataRegister> __l_03;
  uint32_t uVar1;
  Map *this_00;
  allocator<char> local_419;
  string local_418;
  uint32_t local_3f8;
  allocator<md::AddressRegister> local_3f1;
  uint32_t update_func_addr;
  iterator local_3e0;
  size_type local_3d8;
  vector<md::AddressRegister,_std::allocator<md::AddressRegister>_> local_3d0;
  allocator<md::DataRegister> local_3b1;
  DataRegister local_3b0;
  DataRegister local_3a0;
  iterator local_390;
  size_type local_388;
  vector<md::DataRegister,_std::allocator<md::DataRegister>_> local_380;
  allocator<char> local_361;
  string local_360;
  allocator<unsigned_char> local_33b;
  uchar local_33a [2];
  iterator local_338;
  size_type local_330;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_328;
  allocator<char> local_309;
  string local_308;
  DataRegister local_2e8;
  DataRegister local_2d8;
  Param local_2c8 [2];
  DataRegister local_2b8;
  DataRegister local_2a8;
  allocator<char> local_291;
  string local_290;
  allocator<char> local_269;
  string local_268;
  AddressRegister local_248;
  allocator<char> local_231;
  string local_230;
  allocator<char> local_209;
  string local_208;
  AddressRegister local_1e8;
  allocator<char> local_1d1;
  string local_1d0;
  AddressRegister local_1b0;
  allocator<char> local_199;
  string local_198;
  AddressRegister local_178;
  Param local_168 [2];
  DataRegister local_158;
  Param local_148 [2];
  allocator<md::AddressRegister> local_131;
  AddressRegister local_130;
  iterator local_120;
  size_type local_118;
  vector<md::AddressRegister,_std::allocator<md::AddressRegister>_> local_110;
  allocator<md::DataRegister> local_f5 [13];
  DataRegister local_e8;
  DataRegister local_d8;
  iterator local_c8;
  size_type local_c0;
  vector<md::DataRegister,_std::allocator<md::DataRegister>_> local_b8;
  undefined1 local_a0 [8];
  Code func;
  uint32_t func_process_entity;
  World *world_local;
  ROM *rom_local;
  PatchOptimizeDestelWellMap *this_local;
  
  func._labels._M_t._M_impl.super__Rb_tree_header._M_node_count._4_4_ =
       inject_func_process_entity(rom);
  md::Code::Code((Code *)local_a0);
  md::DataRegister::DataRegister(&local_e8,'\0');
  md::DataRegister::DataRegister(&local_d8,'\x01');
  local_c8 = &local_e8;
  local_c0 = 2;
  std::allocator<md::DataRegister>::allocator(local_f5);
  __l_03._M_len = local_c0;
  __l_03._M_array = local_c8;
  std::vector<md::DataRegister,_std::allocator<md::DataRegister>_>::vector
            (&local_b8,__l_03,local_f5);
  md::AddressRegister::AddressRegister(&local_130,'\0');
  local_120 = &local_130;
  local_118 = 1;
  std::allocator<md::AddressRegister>::allocator(&local_131);
  __l_02._M_len = local_118;
  __l_02._M_array = local_120;
  std::vector<md::AddressRegister,_std::allocator<md::AddressRegister>_>::vector
            (&local_110,__l_02,&local_131);
  md::Code::movem_to_stack((Code *)local_a0,&local_b8,&local_110);
  std::vector<md::AddressRegister,_std::allocator<md::AddressRegister>_>::~vector(&local_110);
  std::allocator<md::AddressRegister>::~allocator(&local_131);
  std::vector<md::DataRegister,_std::allocator<md::DataRegister>_>::~vector(&local_b8);
  std::allocator<md::DataRegister>::~allocator(local_f5);
  addr_<void>((uint32_t)local_148,0xff1001);
  md::DataRegister::DataRegister(&local_158,'\x01');
  md::Code::moveb((Code *)local_a0,local_148,(Param *)&local_158);
  addr_<void>((uint32_t)local_168,0xff1001);
  md::Code::clrb((Code *)local_a0,local_168);
  md::AddressRegister::AddressRegister(&local_178,'\0');
  md::Code::lea((Code *)local_a0,0xff5400,&local_178);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_198,"loop",&local_199);
  md::Code::label((Code *)local_a0,&local_198);
  std::__cxx11::string::~string((string *)&local_198);
  std::allocator<char>::~allocator(&local_199);
  md::AddressRegister::AddressRegister(&local_1b0,'\0');
  md::Code::cmpa((Code *)local_a0,0xff5480,&local_1b0);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_1d0,"next_entity",&local_1d1);
  md::Code::beq((Code *)local_a0,&local_1d0);
  std::__cxx11::string::~string((string *)&local_1d0);
  std::allocator<char>::~allocator(&local_1d1);
  md::AddressRegister::AddressRegister(&local_1e8,'\0');
  md::Code::cmpa((Code *)local_a0,0xff5b00,&local_1e8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_208,"ret",&local_209);
  md::Code::beq((Code *)local_a0,&local_208);
  std::__cxx11::string::~string((string *)&local_208);
  std::allocator<char>::~allocator(&local_209);
  md::Code::jsr((Code *)local_a0,func._labels._M_t._M_impl.super__Rb_tree_header._M_node_count._4_4_
               );
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_230,"next_entity",&local_231);
  md::Code::label((Code *)local_a0,&local_230);
  std::__cxx11::string::~string((string *)&local_230);
  std::allocator<char>::~allocator(&local_231);
  md::AddressRegister::AddressRegister(&local_248,'\0');
  md::Code::adda((Code *)local_a0,0x80,&local_248);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_268,"loop",&local_269);
  md::Code::bra((Code *)local_a0,&local_268);
  std::__cxx11::string::~string((string *)&local_268);
  std::allocator<char>::~allocator(&local_269);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_290,"ret",&local_291);
  md::Code::label((Code *)local_a0,&local_290);
  std::__cxx11::string::~string((string *)&local_290);
  std::allocator<char>::~allocator(&local_291);
  md::DataRegister::DataRegister(&local_2a8,'\x01');
  md::Code::notb((Code *)local_a0,&local_2a8);
  md::DataRegister::DataRegister(&local_2b8,'\x01');
  md::Code::andib((Code *)local_a0,'\x0f',(Param *)&local_2b8);
  addr_<void>((uint32_t)local_2c8,0xff1001);
  md::DataRegister::DataRegister(&local_2d8,'\x01');
  md::Code::andb((Code *)local_a0,local_2c8,&local_2d8);
  md::DataRegister::DataRegister(&local_2e8,'\x01');
  md::Code::tstb((Code *)local_a0,(Param *)&local_2e8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_308,"no_sound",&local_309);
  md::Code::beq((Code *)local_a0,&local_308);
  std::__cxx11::string::~string((string *)&local_308);
  std::allocator<char>::~allocator(&local_309);
  local_33a[0] = '\0';
  local_33a[1] = 0x6c;
  local_338 = local_33a;
  local_330 = 2;
  std::allocator<unsigned_char>::allocator(&local_33b);
  __l_01._M_len = local_330;
  __l_01._M_array = local_338;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector(&local_328,__l_01,&local_33b);
  md::Code::trap((Code *)local_a0,'\0',&local_328);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector(&local_328);
  std::allocator<unsigned_char>::~allocator(&local_33b);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_360,"no_sound",&local_361);
  md::Code::label((Code *)local_a0,&local_360);
  std::__cxx11::string::~string((string *)&local_360);
  std::allocator<char>::~allocator(&local_361);
  md::DataRegister::DataRegister(&local_3b0,'\0');
  md::DataRegister::DataRegister(&local_3a0,'\x01');
  local_390 = &local_3b0;
  local_388 = 2;
  std::allocator<md::DataRegister>::allocator(&local_3b1);
  __l_00._M_len = local_388;
  __l_00._M_array = local_390;
  std::vector<md::DataRegister,_std::allocator<md::DataRegister>_>::vector
            (&local_380,__l_00,&local_3b1);
  md::AddressRegister::AddressRegister((AddressRegister *)&update_func_addr,'\0');
  local_3e0 = (iterator)&update_func_addr;
  local_3d8 = 1;
  std::allocator<md::AddressRegister>::allocator(&local_3f1);
  __l._M_len = local_3d8;
  __l._M_array = local_3e0;
  std::vector<md::AddressRegister,_std::allocator<md::AddressRegister>_>::vector
            (&local_3d0,__l,&local_3f1);
  md::Code::movem_from_stack((Code *)local_a0,&local_380,&local_3d0);
  std::vector<md::AddressRegister,_std::allocator<md::AddressRegister>_>::~vector(&local_3d0);
  std::allocator<md::AddressRegister>::~allocator(&local_3f1);
  std::vector<md::DataRegister,_std::allocator<md::DataRegister>_>::~vector(&local_380);
  std::allocator<md::DataRegister>::~allocator(&local_3b1);
  md::Code::rts((Code *)local_a0);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_418,"",&local_419);
  uVar1 = md::ROM::inject_code(rom,(Code *)local_a0,&local_418);
  std::__cxx11::string::~string((string *)&local_418);
  std::allocator<char>::~allocator(&local_419);
  local_3f8 = uVar1;
  this_00 = World::map(world,0x112);
  Map::map_update_addr(this_00,local_3f8);
  md::Code::~Code((Code *)local_a0);
  return;
}

Assistant:

void inject_code(md::ROM& rom, World& world) override
    {
        uint32_t func_process_entity = inject_func_process_entity(rom);

        md::Code func;
        func.movem_to_stack({ reg_D0, reg_D1 }, { reg_A0 });
        {
            func.moveb(addr_(0xFF1001), reg_D1);    // Store old flag state in D1
            func.clrb(addr_(0xFF1001));

            func.lea(0xFF5400, reg_A0);
            func.label("loop");
            {
                func.cmpa(0xFF5480, reg_A0); // No need to check anything with the door
                func.beq("next_entity");
                func.cmpa(0xFF5B00, reg_A0); // End of array
                func.beq("ret");
                func.jsr(func_process_entity);
                func.label("next_entity");
                func.adda(0x80, reg_A0);
            }
            func.bra("loop");
        }
        func.label("ret");
        // Compare old flag state to new flag state: if any new holes have been filled, play a switch sound
        func.notb(reg_D1);
        func.andib(0x0F, reg_D1);
        func.andb(addr_(0xFF1001), reg_D1);
        func.tstb(reg_D1);
        func.beq("no_sound");
        {
            func.trap(0, { 0x00, 0x6C });
        }
        func.label("no_sound");
        func.movem_from_stack({ reg_D0, reg_D1 }, { reg_A0 });
        func.rts();

        uint32_t update_func_addr = rom.inject_code(func);
        world.map(MAP_DESTEL_WELL_274)->map_update_addr(update_func_addr);
    }